

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O3

bool __thiscall
cmDependsFortran::Finalize(cmDependsFortran *this,ostream *makeDepends,ostream *internalDepends)

{
  cmMakefile *this_00;
  pointer pcVar1;
  cmDependsFortranInternals *pcVar2;
  string *psVar3;
  _Base_ptr p_Var4;
  ostream *poVar5;
  _Rb_tree_header *p_Var6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string mod_dir;
  string fiName;
  string currentBinDir;
  string fcName;
  string stamp;
  string mod_lower;
  string mod_upper;
  cmGeneratedFileStream fiStream;
  cmGeneratedFileStream fcStream;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  undefined1 local_4c0 [584];
  cmGeneratedFileStream local_278;
  
  LocateModules(this);
  this_00 = ((this->super_cmDepends).LocalGenerator)->Makefile;
  local_4c0._0_8_ = local_4c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4c0,"CMAKE_Fortran_TARGET_MODULE_DIR","");
  psVar3 = cmMakefile::GetSafeDefinition(this_00,(string *)local_4c0);
  local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5c0,pcVar1,pcVar1 + psVar3->_M_string_length);
  if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
    operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
  }
  if (local_5c0._M_string_length == 0) {
    cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmDepends).LocalGenerator);
    std::__cxx11::string::_M_assign((string *)&local_5c0);
  }
  p_Var4 = (this->Internal->ObjectInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(this->Internal->ObjectInfo)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var6) {
    do {
      WriteDependenciesReal
                (this,(string *)(p_Var4 + 1),(cmFortranSourceInfo *)(p_Var4 + 2),&local_5c0,
                 &(this->super_cmDepends).TargetDirectory,makeDepends,internalDepends);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var6);
  }
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  pcVar1 = (this->super_cmDepends).TargetDirectory._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_580,pcVar1,
             pcVar1 + (this->super_cmDepends).TargetDirectory._M_string_length);
  std::__cxx11::string::append((char *)&local_580);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_4c0,&local_580,false,None);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4c0,"# The fortran modules provided by this target.\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"provides\n",9);
  pcVar2 = this->Internal;
  p_Var4 = (pcVar2->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(pcVar2->TargetProvides)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var6) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0," ",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_4c0,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var6);
  }
  if ((pcVar2->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
    pcVar1 = (this->super_cmDepends).TargetDirectory._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_540,pcVar1,
               pcVar1 + (this->super_cmDepends).TargetDirectory._M_string_length);
    std::__cxx11::string::append((char *)&local_540);
    cmGeneratedFileStream::cmGeneratedFileStream(&local_278,&local_540,false,None);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"# Remove fortran modules provided by this target.\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"FILE(REMOVE",0xb);
    psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                       ((this->super_cmDepends).LocalGenerator);
    local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
    pcVar1 = (psVar3->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_560,pcVar1,pcVar1 + psVar3->_M_string_length);
    p_Var4 = (pcVar2->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var4 != p_Var6) {
      do {
        local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4e0,local_5c0._M_dataplus._M_p,
                   local_5c0._M_dataplus._M_p + local_5c0._M_string_length);
        std::__cxx11::string::append((char *)&local_4e0);
        local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_500,local_5c0._M_dataplus._M_p,
                   local_5c0._M_dataplus._M_p + local_5c0._M_string_length);
        std::__cxx11::string::append((char *)&local_500);
        cmFortranModuleAppendUpperLower((string *)(p_Var4 + 1),&local_4e0,&local_500);
        local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
        pcVar1 = (this->super_cmDepends).TargetDirectory._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_520,pcVar1,
                   pcVar1 + (this->super_cmDepends).TargetDirectory._M_string_length);
        std::__cxx11::string::append((char *)&local_520);
        std::__cxx11::string::_M_append((char *)&local_520,*(ulong *)(p_Var4 + 1));
        std::__cxx11::string::append((char *)&local_520);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  \"",3);
        MaybeConvertToRelativePath(&local_5a0,this,&local_560,&local_500);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_278,local_5a0._M_dataplus._M_p,
                            local_5a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
          operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  \"",3);
        MaybeConvertToRelativePath(&local_5a0,this,&local_560,&local_4e0);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_278,local_5a0._M_dataplus._M_p,
                            local_5a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
          operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  \"",3);
        MaybeConvertToRelativePath(&local_5a0,this,&local_560,&local_520);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_278,local_5a0._M_dataplus._M_p,
                            local_5a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
          operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520._M_dataplus._M_p != &local_520.field_2) {
          operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != &local_500.field_2) {
          operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
          operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  )\n",4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_560._M_dataplus._M_p != &local_560.field_2) {
      operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._M_dataplus._M_p != &local_540.field_2) {
      operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool cmDependsFortran::Finalize(std::ostream& makeDepends,
                                std::ostream& internalDepends)
{
  // Prepare the module search process.
  this->LocateModules();

  // Get the directory in which stamp files will be stored.
  const std::string& stamp_dir = this->TargetDirectory;

  // Get the directory in which module files will be created.
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  std::string mod_dir =
    mf->GetSafeDefinition("CMAKE_Fortran_TARGET_MODULE_DIR");
  if (mod_dir.empty()) {
    mod_dir = this->LocalGenerator->GetCurrentBinaryDirectory();
  }

  // Actually write dependencies to the streams.
  typedef cmDependsFortranInternals::ObjectInfoMap ObjectInfoMap;
  ObjectInfoMap const& objInfo = this->Internal->ObjectInfo;
  for (auto const& i : objInfo) {
    if (!this->WriteDependenciesReal(i.first, i.second, mod_dir, stamp_dir,
                                     makeDepends, internalDepends)) {
      return false;
    }
  }

  // Store the list of modules provided by this target.
  std::string fiName = this->TargetDirectory;
  fiName += "/fortran.internal";
  cmGeneratedFileStream fiStream(fiName);
  fiStream << "# The fortran modules provided by this target.\n";
  fiStream << "provides\n";
  std::set<std::string> const& provides = this->Internal->TargetProvides;
  for (std::string const& i : provides) {
    fiStream << " " << i << "\n";
  }

  // Create a script to clean the modules.
  if (!provides.empty()) {
    std::string fcName = this->TargetDirectory;
    fcName += "/cmake_clean_Fortran.cmake";
    cmGeneratedFileStream fcStream(fcName);
    fcStream << "# Remove fortran modules provided by this target.\n";
    fcStream << "FILE(REMOVE";
    std::string currentBinDir =
      this->LocalGenerator->GetCurrentBinaryDirectory();
    for (std::string const& i : provides) {
      std::string mod_upper = mod_dir;
      mod_upper += "/";
      std::string mod_lower = mod_dir;
      mod_lower += "/";
      cmFortranModuleAppendUpperLower(i, mod_upper, mod_lower);
      std::string stamp = stamp_dir;
      stamp += "/";
      stamp += i;
      stamp += ".stamp";
      fcStream << "\n";
      fcStream << "  \""
               << this->MaybeConvertToRelativePath(currentBinDir, mod_lower)
               << "\"\n";
      fcStream << "  \""
               << this->MaybeConvertToRelativePath(currentBinDir, mod_upper)
               << "\"\n";
      fcStream << "  \""
               << this->MaybeConvertToRelativePath(currentBinDir, stamp)
               << "\"\n";
    }
    fcStream << "  )\n";
  }
  return true;
}